

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O2

void __thiscall QList<Header>::replace(QList<Header> *this,qsizetype i,rvalue_ref t)

{
  long in_FS_OFFSET;
  DataPointer oldData;
  QArrayDataPointer<Header> local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.d = (Data *)0x0;
  local_48.ptr = (Header *)0x0;
  local_48.size = 0;
  QArrayDataPointer<Header>::detach(&this->d,&local_48);
  Header::operator=((this->d).ptr + i,t);
  QArrayDataPointer<Header>::~QArrayDataPointer(&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void replace(qsizetype i, rvalue_ref t)
    {
        if constexpr (DataPointer::pass_parameter_by_value) {
            Q_UNUSED(i);
            Q_UNUSED(t);
        } else {
            Q_ASSERT_X(i >= 0 && i < d->size, "QList<T>::replace", "index out of range");
            DataPointer oldData;
            d.detach(&oldData);
            d.data()[i] = std::move(t);
        }
    }